

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

TValue * mmcall(lua_State *L,ASMFunction cont,cTValue *mo,cTValue *a,cTValue *b)

{
  TValue *local_c8;
  TValue *top;
  cTValue *b_local;
  cTValue *a_local;
  cTValue *mo_local;
  ASMFunction cont_local;
  lua_State *L_local;
  
  local_c8 = L->top;
  if (*(char *)((L->base[-2].u64 & 0x7fffffffffff) + 10) == '\0') {
    local_c8 = L->base + (int)(uint)*(byte *)(*(long *)((L->base[-2].u64 & 0x7fffffffffff) + 0x20) +
                                             -0x5d);
  }
  *local_c8 = (TValue)cont;
  local_c8[1].u64 = 0xffffffffffffffff;
  local_c8[2] = *mo;
  local_c8[3].u64 = 0xffffffffffffffff;
  local_c8[4] = *a;
  local_c8[5] = *b;
  return local_c8 + 4;
}

Assistant:

static TValue *mmcall(lua_State *L, ASMFunction cont, cTValue *mo,
		    cTValue *a, cTValue *b)
{
  /*
  **           |-- framesize -> top       top+1       top+2 top+3
  ** before:   [func slots ...]
  ** mm setup: [func slots ...] [cont|?]  [mo|tmtype] [a]   [b]
  ** in asm:   [func slots ...] [cont|PC] [mo|delta]  [a]   [b]
  **           ^-- func base                          ^-- mm base
  ** after mm: [func slots ...]           [result]
  **                ^-- copy to base[PC_RA] --/     for lj_cont_ra
  **                          istruecond + branch   for lj_cont_cond*
  **                                       ignore   for lj_cont_nop
  ** next PC:  [func slots ...]
  */
  TValue *top = L->top;
  if (curr_funcisL(L)) top = curr_topL(L);
  setcont(top++, cont);  /* Assembler VM stores PC in upper word or FR2. */
  if (LJ_FR2) setnilV(top++);
  copyTV(L, top++, mo);  /* Store metamethod and two arguments. */
  if (LJ_FR2) setnilV(top++);
  copyTV(L, top, a);
  copyTV(L, top+1, b);
  return top;  /* Return new base. */
}